

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

bool __thiscall pbrt::Integrator::IntersectP(Integrator *this,Ray *ray,Float tMax)

{
  bool bVar1;
  long in_RDI;
  long *in_FS_OFFSET;
  PrimitiveHandle *unaff_retaddr;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  *(long *)(*in_FS_OFFSET + -0x378) = *(long *)(*in_FS_OFFSET + -0x378) + 1;
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RDI + 0x20));
  if (bVar1) {
    bVar1 = PrimitiveHandle::IntersectP
                      (unaff_retaddr,
                       (Ray *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       (Float)((ulong)in_RDI >> 0x20));
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Integrator::IntersectP(const Ray &ray, Float tMax) const {
    ++nShadowTests;
    DCHECK_NE(ray.d, Vector3f(0, 0, 0));
    if (aggregate)
        return aggregate.IntersectP(ray, tMax);
    else
        return false;
}